

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int memCmpRev(void *buf1,void *buf2,size_t count)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  bool bVar5;
  word w2;
  word w1;
  word greater;
  word less;
  size_t count_local;
  void *buf2_local;
  void *buf1_local;
  
  bVar5 = false;
  bVar3 = false;
  count_local = count;
  if ((count & 7) != 0) {
    w2 = 0;
    w1 = 0;
    count_local = count;
    while ((count_local & 7) != 0) {
      w1 = w1 << 8 | (ulong)*(byte *)((long)buf1 + (count_local - 1));
      w2 = w2 << 8 | (ulong)*(byte *)((long)buf2 + (count_local - 1));
      count_local = count_local - 1;
    }
    bVar5 = w1 < w2;
    bVar3 = !bVar5 && w2 < w1;
  }
  count_local = count_local >> 3;
  while (sVar4 = count_local - 1, count_local != 0) {
    uVar1 = *(ulong *)((long)buf1 + sVar4 * 8);
    uVar2 = *(ulong *)((long)buf2 + sVar4 * 8);
    bVar5 = (bool)((bVar3 ^ 1U) & uVar1 < uVar2 | bVar5);
    bVar3 = (bool)((bVar5 ^ 1U) & uVar2 < uVar1 | bVar3);
    count_local = sVar4;
  }
  return !bVar5 - 1 | (uint)bVar3;
}

Assistant:

int SAFE(memCmpRev)(const void* buf1, const void* buf2, size_t count)
{
	register word less = 0;
	register word greater = 0;
	register word w1;
	register word w2;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	if (count % O_PER_W)
	{
		w1 = w2 = 0;
		while (count % O_PER_W)
		{
			w1 = w1 << 8 | ((const octet*)buf1)[--count];
			w2 = w2 << 8 | ((const octet*)buf2)[count];
		}
		less |= ~greater & wordLess01(w1, w2);
		greater |= ~less & wordGreater01(w1, w2);
	}
	count /= O_PER_W;
	while (count--)
	{
		w1 = ((const word*)buf1)[count];
		w2 = ((const word*)buf2)[count];
#if (OCTET_ORDER == BIG_ENDIAN)
		w1 = wordRev(w1);
		w2 = wordRev(w2);
#endif
		less |= ~greater & wordLess(w1, w2);
		greater |= ~less & wordGreater(w1, w2);
	}
	w1 = w2 = 0;
	return (wordEq(less, 0) - 1) | wordNeq(greater, 0);
}